

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::mrg5s>(mrg5s *r,string *name)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  uVar8 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar8 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar8 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar8);
  iVar5 = 0xf;
  do {
    iVar4 = (r->S).r[0];
    iVar6 = (r->S).r[1];
    iVar1 = (r->S).r[2];
    iVar2 = (r->S).r[3];
    uVar7 = (long)(r->P).a[3] * (long)iVar2 + (long)(r->P).a[2] * (long)iVar1 +
            (long)(r->P).a[1] * (long)iVar6 + (long)(r->P).a[0] * (long)iVar4;
    uVar8 = uVar7 + 0x8000b0e1c2e43c3e;
    if (uVar7 < 0x7fff4f1e3d1bc3c2) {
      uVar8 = uVar7;
    }
    uVar8 = (long)(r->S).r[4] * (long)(r->P).a[4] + uVar8;
    (r->S).r[4] = iVar2;
    (r->S).r[3] = iVar1;
    (r->S).r[2] = iVar6;
    (r->S).r[1] = iVar4;
    uVar8 = (uVar8 >> 0x1f) * -0x7fffa78f + uVar8;
    uVar8 = (uVar8 >> 0x1f) * -0x7fffa78f + uVar8;
    iVar4 = (int)uVar8;
    iVar6 = iVar4 + -0x7fffa78f;
    if (uVar8 < 0x7fffa78f) {
      iVar6 = iVar4;
    }
    (r->S).r[0] = iVar6;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 6),1);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = (r->S).r[0];
  iVar4 = (r->S).r[1];
  iVar6 = (r->S).r[2];
  iVar1 = (r->S).r[3];
  uVar7 = (long)(r->P).a[3] * (long)iVar1 + (long)(r->P).a[2] * (long)iVar6 +
          (long)(r->P).a[1] * (long)iVar4 + (long)(r->P).a[0] * (long)iVar5;
  uVar8 = uVar7 + 0x8000b0e1c2e43c3e;
  if (uVar7 < 0x7fff4f1e3d1bc3c2) {
    uVar8 = uVar7;
  }
  uVar8 = (long)(r->S).r[4] * (long)(r->P).a[4] + uVar8;
  (r->S).r[4] = iVar1;
  (r->S).r[3] = iVar6;
  (r->S).r[2] = iVar4;
  (r->S).r[1] = iVar5;
  uVar8 = (uVar8 >> 0x1f) * -0x7fffa78f + uVar8;
  uVar8 = (uVar8 >> 0x1f) * -0x7fffa78f + uVar8;
  iVar4 = (int)uVar8;
  iVar5 = iVar4 + -0x7fffa78f;
  if (uVar8 < 0x7fffa78f) {
    iVar5 = iVar4;
  }
  (r->S).r[0] = iVar5;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}